

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

mu * __thiscall llvm::APInt::magicu(mu *__return_storage_ptr__,APInt *this,uint LeadingZeros)

{
  bool bVar1;
  uint local_254;
  APInt local_240;
  APInt signedMin;
  APInt r2;
  APInt q1;
  APInt nc;
  APInt signedMax;
  APInt r1;
  APInt local_1d0;
  APInt q2;
  APInt delta;
  APInt local_1a0;
  APInt allOnes;
  APInt local_180;
  APInt local_170;
  APInt local_160;
  APInt local_150;
  APInt local_140;
  APInt local_130;
  APInt local_120;
  APInt local_110;
  APInt local_100;
  APInt local_f0;
  APInt local_e0;
  APInt local_d0;
  APInt local_c0;
  APInt local_b0;
  APInt local_a0;
  APInt local_90;
  APInt local_80;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  
  r2.BitWidth = 1;
  nc.U.VAL = 0;
  delta.U.VAL = 0;
  q1.U.VAL = 0;
  r1.U.VAL = 0;
  q2.U.VAL = 0;
  r2.U.VAL = 0;
  (__return_storage_ptr__->m).BitWidth = 1;
  (__return_storage_ptr__->m).U.VAL = 0;
  __return_storage_ptr__->a = false;
  q1.BitWidth = r2.BitWidth;
  nc.BitWidth = r2.BitWidth;
  r1.BitWidth = r2.BitWidth;
  q2.BitWidth = r2.BitWidth;
  delta.BitWidth = r2.BitWidth;
  getAllOnesValue(&signedMin,this->BitWidth);
  lshr(&allOnes,(uint)&signedMin);
  ~APInt(&signedMin);
  getSignedMinValue(&signedMin,this->BitWidth);
  getSignedMaxValue(&signedMax,this->BitWidth);
  APInt(&local_1a0,&allOnes);
  operator-((llvm *)&local_40,&local_1a0,this);
  urem(&local_1d0,&local_40);
  operator-((llvm *)&local_240,&allOnes,&local_1d0);
  operator=(&nc,&local_240);
  ~APInt(&local_240);
  ~APInt(&local_1d0);
  ~APInt(&local_40);
  ~APInt(&local_1a0);
  local_254 = this->BitWidth;
  udiv(&local_240,&signedMin);
  operator=(&q1,&local_240);
  ~APInt(&local_240);
  operator*(&local_1d0,&q1);
  operator-((llvm *)&local_240,&signedMin,&local_1d0);
  operator=(&r1,&local_240);
  ~APInt(&local_240);
  ~APInt(&local_1d0);
  udiv(&local_240,&signedMax);
  operator=(&q2,&local_240);
  ~APInt(&local_240);
  operator*(&local_1d0,&q2);
  operator-((llvm *)&local_240,&signedMax,&local_1d0);
  operator=(&r2,&local_240);
  ~APInt(&local_240);
  ~APInt(&local_1d0);
  do {
    APInt(&local_50,&nc);
    operator-((llvm *)&local_240,&local_50,&r1);
    bVar1 = uge(&r1,&local_240);
    ~APInt(&local_240);
    ~APInt(&local_50);
    if (bVar1) {
      APInt(&local_70,&q1);
      operator+((llvm *)&local_60,&local_70,&q1);
      operator+((llvm *)&local_240,&local_60,1);
      operator=(&q1,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_60);
      ~APInt(&local_70);
      APInt(&local_90,&r1);
      operator+((llvm *)&local_80,&local_90,&r1);
      operator-((llvm *)&local_240,&local_80,&nc);
      operator=(&r1,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_80);
      ~APInt(&local_90);
    }
    else {
      APInt(&local_a0,&q1);
      operator+((llvm *)&local_240,&local_a0,&q1);
      operator=(&q1,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_a0);
      APInt(&local_b0,&r1);
      operator+((llvm *)&local_240,&local_b0,&r1);
      operator=(&r1,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_b0);
    }
    APInt(&local_c0,&r2);
    operator+((llvm *)&local_240,&local_c0,1);
    APInt(&local_d0,this);
    operator-((llvm *)&local_1d0,&local_d0,&r2);
    bVar1 = uge(&local_240,&local_1d0);
    ~APInt(&local_1d0);
    ~APInt(&local_d0);
    ~APInt(&local_240);
    ~APInt(&local_c0);
    if (bVar1) {
      bVar1 = uge(&q2,&signedMax);
      if (bVar1) {
        __return_storage_ptr__->a = true;
      }
      APInt(&local_f0,&q2);
      operator+((llvm *)&local_e0,&local_f0,&q2);
      operator+((llvm *)&local_240,&local_e0,1);
      operator=(&q2,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_e0);
      ~APInt(&local_f0);
      APInt(&local_120,&r2);
      operator+((llvm *)&local_110,&local_120,&r2);
      operator+((llvm *)&local_100,&local_110,1);
      operator-((llvm *)&local_240,&local_100,this);
      operator=(&r2,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_100);
      ~APInt(&local_110);
      ~APInt(&local_120);
    }
    else {
      bVar1 = uge(&q2,&signedMin);
      if (bVar1) {
        __return_storage_ptr__->a = true;
      }
      APInt(&local_130,&q2);
      operator+((llvm *)&local_240,&local_130,&q2);
      operator=(&q2,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_130);
      APInt(&local_150,&r2);
      operator+((llvm *)&local_140,&local_150,&r2);
      operator+((llvm *)&local_240,&local_140,1);
      operator=(&r2,&local_240);
      ~APInt(&local_240);
      ~APInt(&local_140);
      ~APInt(&local_150);
    }
    APInt(&local_170,this);
    operator-((llvm *)&local_160,&local_170,1);
    operator-((llvm *)&local_240,&local_160,&r2);
    operator=(&delta,&local_240);
    ~APInt(&local_240);
    ~APInt(&local_160);
    ~APInt(&local_170);
    if (this->BitWidth * 2 <= local_254) goto LAB_001686e4;
    bVar1 = ult(&q1,&delta);
    if (!bVar1) {
      bVar1 = operator==(&q1,&delta);
      if (!bVar1) {
LAB_001686e4:
        APInt(&local_180,&q2);
        operator+((llvm *)&local_240,&local_180,1);
        operator=(&__return_storage_ptr__->m,&local_240);
        ~APInt(&local_240);
        ~APInt(&local_180);
        __return_storage_ptr__->s = local_254 - this->BitWidth;
        ~APInt(&signedMax);
        ~APInt(&signedMin);
        ~APInt(&allOnes);
        ~APInt(&r2);
        ~APInt(&q2);
        ~APInt(&r1);
        ~APInt(&q1);
        ~APInt(&delta);
        ~APInt(&nc);
        return __return_storage_ptr__;
      }
      bVar1 = operator==(&r1,0);
      if (!bVar1) goto LAB_001686e4;
    }
    local_254 = local_254 + 1;
  } while( true );
}

Assistant:

APInt::mu APInt::magicu(unsigned LeadingZeros) const {
  const APInt& d = *this;
  unsigned p;
  APInt nc, delta, q1, r1, q2, r2;
  struct mu magu;
  magu.a = 0;               // initialize "add" indicator
  APInt allOnes = APInt::getAllOnesValue(d.getBitWidth()).lshr(LeadingZeros);
  APInt signedMin = APInt::getSignedMinValue(d.getBitWidth());
  APInt signedMax = APInt::getSignedMaxValue(d.getBitWidth());

  nc = allOnes - (allOnes - d).urem(d);
  p = d.getBitWidth() - 1;  // initialize p
  q1 = signedMin.udiv(nc);  // initialize q1 = 2p/nc
  r1 = signedMin - q1*nc;   // initialize r1 = rem(2p,nc)
  q2 = signedMax.udiv(d);   // initialize q2 = (2p-1)/d
  r2 = signedMax - q2*d;    // initialize r2 = rem((2p-1),d)
  do {
    p = p + 1;
    if (r1.uge(nc - r1)) {
      q1 = q1 + q1 + 1;  // update q1
      r1 = r1 + r1 - nc; // update r1
    }
    else {
      q1 = q1+q1; // update q1
      r1 = r1+r1; // update r1
    }
    if ((r2 + 1).uge(d - r2)) {
      if (q2.uge(signedMax)) magu.a = 1;
      q2 = q2+q2 + 1;     // update q2
      r2 = r2+r2 + 1 - d; // update r2
    }
    else {
      if (q2.uge(signedMin)) magu.a = 1;
      q2 = q2+q2;     // update q2
      r2 = r2+r2 + 1; // update r2
    }
    delta = d - 1 - r2;
  } while (p < d.getBitWidth()*2 &&
           (q1.ult(delta) || (q1 == delta && r1 == 0)));
  magu.m = q2 + 1; // resulting magic number
  magu.s = p - d.getBitWidth();  // resulting shift
  return magu;
}